

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseEncoding(State *state)

{
  bool bVar1;
  State *in_RDI;
  State *in_stack_00000008;
  ComplexityGuard guard;
  ComplexityGuard local_18 [2];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar2;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard(local_18,in_RDI);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(local_18);
  if (bVar1) {
    bVar2 = 0;
  }
  else {
    bVar1 = ParseName(in_stack_00000008);
    if (bVar1) {
      bVar1 = ParseBareFunctionType
                        ((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      if (bVar1) {
        ParseQRequiresClauseExpr
                  ((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        bVar2 = 1;
      }
      else {
        bVar2 = 1;
      }
    }
    else {
      bVar1 = ParseSpecialName(state);
      if (bVar1) {
        bVar2 = 1;
      }
      else {
        bVar2 = 0;
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(local_18);
  return (bool)(bVar2 & 1);
}

Assistant:

static bool ParseEncoding(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  // Since the first two productions both start with <name>, attempt
  // to parse it only once to avoid exponential blowup of backtracking.
  //
  // We're careful about exponential blowup because <encoding> recursively
  // appears in other productions downstream of its first two productions,
  // which means that every call to `ParseName` would possibly indirectly
  // result in two calls to `ParseName` etc.
  if (ParseName(state)) {
    if (!ParseBareFunctionType(state)) {
      return true;  // <(data) name>
    }

    // Parsed: <(function) name> <bare-function-type>
    // Pending: [`Q` <requires-clause expr>]
    ParseQRequiresClauseExpr(state);  // restores state on failure
    return true;
  }

  if (ParseSpecialName(state)) {
    return true;  // <special-name>
  }
  return false;
}